

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint in_EDX;
  long in_RSI;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *in_RDI;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *pDst;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *pSrc_end;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *pSrc;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *in_stack_ffffffffffffffc8;
  long local_20;
  
  for (local_20 = in_RSI; local_20 != in_RSI + (ulong)in_EDX * 0x1c; local_20 = local_20 + 0x1c) {
    std::pair<crnlib::vec<6U,_float>,_unsigned_int>::pair(in_RDI,in_stack_ffffffffffffffc8);
    in_RDI = in_RDI + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }